

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary-writer.cc
# Opt level: O2

void __thiscall
wabt::anon_unknown_1::BinaryWriter::WriteExprList(BinaryWriter *this,Func *func,ExprList *exprs)

{
  pointer pVVar1;
  pointer pTVar2;
  Module *pMVar3;
  bool bVar4;
  byte bVar5;
  Index IVar6;
  Address AVar7;
  uint32_t value;
  reference base;
  VarExpr<(wabt::ExprType)50> *pVVar8;
  LoadStoreExpr<(wabt::ExprType)43> *pLVar9;
  TableInitExpr *pTVar10;
  OpcodeExpr<(wabt::ExprType)53> *pOVar11;
  VarExpr<(wabt::ExprType)27> *pVVar12;
  VarExpr<(wabt::ExprType)34> *pVVar13;
  LoadStoreExpr<(wabt::ExprType)44> *pLVar14;
  VarExpr<(wabt::ExprType)48> *pVVar15;
  BrTableExpr *pBVar16;
  ulong uVar17;
  char *pcVar18;
  VarExpr<(wabt::ExprType)49> *pVVar19;
  SelectExpr *pSVar20;
  VarExpr<(wabt::ExprType)12> *pVVar21;
  VarExpr<(wabt::ExprType)8> *pVVar22;
  BlockExprBase<(wabt::ExprType)25> *pBVar23;
  VarExpr<(wabt::ExprType)24> *pVVar24;
  ConstExpr *pCVar25;
  BlockExprBase<(wabt::ExprType)7> *pBVar26;
  SimdLaneOpExpr *pSVar27;
  LoadStoreExpr<(wabt::ExprType)0> *pLVar28;
  CallIndirectExpr *pCVar29;
  OpcodeExpr<(wabt::ExprType)6> *pOVar30;
  VarExpr<(wabt::ExprType)18> *pVVar31;
  BrOnExnExpr *pBVar32;
  VarExpr<(wabt::ExprType)30> *pVVar33;
  TableCopyExpr *pTVar34;
  VarExpr<(wabt::ExprType)22> *pVVar35;
  ReturnCallIndirectExpr *pRVar36;
  VarExpr<(wabt::ExprType)19> *pVVar37;
  SimdShuffleOpExpr *pSVar38;
  VarExpr<(wabt::ExprType)23> *pVVar39;
  VarExpr<(wabt::ExprType)38> *pVVar40;
  VarExpr<(wabt::ExprType)54> *pVVar41;
  char *pcVar42;
  IfExpr *pIVar43;
  VarExpr<(wabt::ExprType)52> *pVVar44;
  VarExpr<(wabt::ExprType)46> *pVVar45;
  VarExpr<(wabt::ExprType)51> *pVVar46;
  RelocType reloc_type;
  int extraout_EDX;
  int __c_01;
  int __c;
  int extraout_EDX_00;
  int __c_00;
  undefined8 extraout_RDX;
  undefined8 uVar47;
  undefined8 extraout_RDX_00;
  Var *var_00;
  Var *var_01;
  undefined8 uVar48;
  Var *var_02;
  ExprList *exprs_00;
  Var *var;
  pointer this_00;
  Stream *pSVar49;
  Opcode OVar50;
  pointer pTVar51;
  const_iterator rhs;
  v128 value_00;
  const_iterator __begin2;
  
  __begin2.node_ = exprs->first_;
  __begin2.list_ = exprs;
  do {
    rhs.node_ = (Expr *)0x0;
    rhs.list_ = exprs;
    bVar4 = intrusive_list<wabt::Expr>::const_iterator::operator!=(&__begin2,rhs);
    if (!bVar4) {
      return;
    }
    base = intrusive_list<wabt::Expr>::const_iterator::operator*(&__begin2);
    switch(base->type_) {
    case AtomicLoad:
      pLVar28 = cast<wabt::LoadStoreExpr<(wabt::ExprType)0>,wabt::Expr>(base);
      goto LAB_0013a78b;
    case AtomicRmw:
      pLVar28 = (LoadStoreExpr<(wabt::ExprType)0> *)
                cast<wabt::LoadStoreExpr<(wabt::ExprType)1>,wabt::Expr>(base);
      goto LAB_0013a78b;
    case AtomicRmwCmpxchg:
      pLVar28 = (LoadStoreExpr<(wabt::ExprType)0> *)
                cast<wabt::LoadStoreExpr<(wabt::ExprType)2>,wabt::Expr>(base);
      goto LAB_0013a78b;
    case AtomicStore:
      pLVar28 = (LoadStoreExpr<(wabt::ExprType)0> *)
                cast<wabt::LoadStoreExpr<(wabt::ExprType)3>,wabt::Expr>(base);
      goto LAB_0013a78b;
    case AtomicNotify:
      pLVar28 = (LoadStoreExpr<(wabt::ExprType)0> *)
                cast<wabt::LoadStoreExpr<(wabt::ExprType)4>,wabt::Expr>(base);
      goto LAB_0013a78b;
    case AtomicWait:
      pLVar28 = (LoadStoreExpr<(wabt::ExprType)0> *)
                cast<wabt::LoadStoreExpr<(wabt::ExprType)5>,wabt::Expr>(base);
LAB_0013a78b:
      WriteOpcode(this->stream_,(Opcode)(pLVar28->opcode).enum_);
      AVar7 = Opcode::GetAlignment(&pLVar28->opcode,pLVar28->align);
      pSVar49 = this->stream_;
      bVar5 = log2_u32(AVar7);
      Stream::WriteU8(pSVar49,(uint)bVar5,"alignment",No);
      pSVar49 = this->stream_;
      value = pLVar28->offset;
      pcVar42 = "memory offset";
      break;
    case Binary:
      pSVar49 = this->stream_;
      pOVar30 = cast<wabt::OpcodeExpr<(wabt::ExprType)6>,wabt::Expr>(base);
      OVar50.enum_ = (pOVar30->opcode).enum_;
      goto LAB_0013ac6d;
    case Block:
      WriteOpcode(this->stream_,(Opcode)0x2);
      pBVar26 = cast<wabt::BlockExprBase<(wabt::ExprType)7>,wabt::Expr>(base);
      WriteBlockDecl(this,&(pBVar26->block).decl);
      pBVar23 = (BlockExprBase<(wabt::ExprType)25> *)
                cast<wabt::BlockExprBase<(wabt::ExprType)7>,wabt::Expr>(base);
      goto LAB_0013a6af;
    case Br:
      pcVar42 = (char *)0xc;
      WriteOpcode(this->stream_,(Opcode)0xc);
      pSVar49 = this->stream_;
      pVVar22 = cast<wabt::VarExpr<(wabt::ExprType)8>,wabt::Expr>(base);
      __c_00 = extraout_EDX_00;
      goto LAB_0013a91d;
    case BrIf:
      pcVar42 = (char *)0xd;
      WriteOpcode(this->stream_,(Opcode)0xd);
      pSVar49 = this->stream_;
      pVVar22 = (VarExpr<(wabt::ExprType)8> *)
                cast<wabt::VarExpr<(wabt::ExprType)9>,wabt::Expr>(base);
      __c_00 = extraout_EDX;
LAB_0013a91d:
      pcVar42 = Var::index(&pVVar22->var,pcVar42,__c_00);
      value = (uint32_t)pcVar42;
      pcVar42 = "break depth";
      break;
    case BrOnExn:
      pBVar32 = cast<wabt::BrOnExnExpr,wabt::Expr>(base);
      pcVar42 = (char *)0xa;
      WriteOpcode(this->stream_,(Opcode)0xa);
      pSVar49 = this->stream_;
      pcVar42 = Var::index(&pBVar32->label_var,pcVar42,__c);
      WriteU32Leb128(pSVar49,(uint32_t)pcVar42,"break depth");
      pSVar49 = this->stream_;
      value = Module::GetEventIndex(this->module_,&pBVar32->event_var);
      pcVar42 = "event index";
      break;
    case BrTable:
      pBVar16 = cast<wabt::BrTableExpr,wabt::Expr>(base);
      WriteOpcode(this->stream_,(Opcode)0xe);
      uVar17 = ((long)(pBVar16->targets).super__Vector_base<wabt::Var,_std::allocator<wabt::Var>_>.
                      _M_impl.super__Vector_impl_data._M_finish -
               (long)(pBVar16->targets).super__Vector_base<wabt::Var,_std::allocator<wabt::Var>_>.
                     _M_impl.super__Vector_impl_data._M_start) / 0x48;
      pcVar42 = (char *)(uVar17 & 0xffffffff);
      WriteU32Leb128(this->stream_,(uint32_t)uVar17,"num targets");
      pVVar1 = (pBVar16->targets).super__Vector_base<wabt::Var,_std::allocator<wabt::Var>_>._M_impl.
               super__Vector_impl_data._M_finish;
      uVar47 = extraout_RDX;
      for (this_00 = (pBVar16->targets).super__Vector_base<wabt::Var,_std::allocator<wabt::Var>_>.
                     _M_impl.super__Vector_impl_data._M_start; this_00 != pVVar1;
          this_00 = this_00 + 1) {
        pcVar18 = Var::index(this_00,pcVar42,(int)uVar47);
        pcVar42 = (char *)((ulong)pcVar18 & 0xffffffff);
        WriteU32Leb128(this->stream_,(uint32_t)pcVar18,"break depth");
        uVar47 = extraout_RDX_00;
      }
      pcVar42 = Var::index(&pBVar16->default_target,pcVar42,(int)uVar47);
      WriteU32Leb128(this->stream_,(uint32_t)pcVar42,"break depth for default");
      goto switchD_0013a235_default;
    case Call:
      pMVar3 = this->module_;
      pVVar21 = cast<wabt::VarExpr<(wabt::ExprType)12>,wabt::Expr>(base);
      IVar6 = Module::GetFuncIndex(pMVar3,&pVVar21->var);
      pSVar49 = this->stream_;
      OVar50.enum_ = Call;
      goto LAB_0013ab93;
    case CallIndirect:
      pMVar3 = this->module_;
      pCVar29 = cast<wabt::CallIndirectExpr,wabt::Expr>(base);
      IVar6 = Module::GetFuncTypeIndex(pMVar3,&pCVar29->decl);
      pMVar3 = this->module_;
      pCVar29 = cast<wabt::CallIndirectExpr,wabt::Expr>(base);
      value = Module::GetTableIndex(pMVar3,&pCVar29->table);
      pSVar49 = this->stream_;
      OVar50.enum_ = CallIndirect;
      goto LAB_0013aa5b;
    case Compare:
      pSVar49 = this->stream_;
      pOVar11 = (OpcodeExpr<(wabt::ExprType)53> *)
                cast<wabt::OpcodeExpr<(wabt::ExprType)14>,wabt::Expr>(base);
      goto LAB_0013a407;
    case Const:
      pCVar25 = cast<wabt::ConstExpr,wabt::Expr>(base);
      switch((pCVar25->const_).type_.enum_) {
      case V128:
        WriteOpcode(this->stream_,(Opcode)0xd7);
        pSVar49 = this->stream_;
        uVar47 = *(undefined8 *)(pCVar25->const_).data_.v;
        uVar48 = *(undefined8 *)((pCVar25->const_).data_.v + 8);
        pcVar42 = "v128 literal";
        goto LAB_0013ab02;
      case F64:
        WriteOpcode(this->stream_,(Opcode)0x38);
        Stream::WriteU64(this->stream_,*(uint64_t *)(pCVar25->const_).data_.v,"f64 literal",No);
        break;
      case F32:
        WriteOpcode(this->stream_,(Opcode)0x37);
        Stream::WriteU32(this->stream_,*(uint32_t *)(pCVar25->const_).data_.v,"f32 literal",No);
        break;
      case I64:
        WriteOpcode(this->stream_,(Opcode)0x36);
        WriteS64Leb128(this->stream_,*(uint64_t *)(pCVar25->const_).data_.v,"i64 literal");
        break;
      case I32:
        WriteOpcode(this->stream_,(Opcode)0x35);
        WriteS32Leb128(this->stream_,*(uint32_t *)(pCVar25->const_).data_.v,"i32 literal");
        break;
      default:
        __assert_fail("0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/asbish[P]wabt/src/binary-writer.cc"
                      ,0x201,
                      "void wabt::(anonymous namespace)::BinaryWriter::WriteExpr(const Func *, const Expr *)"
                     );
      }
      goto switchD_0013a235_default;
    case Convert:
      pSVar49 = this->stream_;
      pOVar11 = (OpcodeExpr<(wabt::ExprType)53> *)
                cast<wabt::OpcodeExpr<(wabt::ExprType)16>,wabt::Expr>(base);
      goto LAB_0013a407;
    case Drop:
      pSVar49 = this->stream_;
      OVar50.enum_ = Drop;
      goto LAB_0013ac6d;
    case GlobalGet:
      pMVar3 = this->module_;
      pVVar31 = cast<wabt::VarExpr<(wabt::ExprType)18>,wabt::Expr>(base);
      IVar6 = Module::GetGlobalIndex(pMVar3,&pVVar31->var);
      pSVar49 = this->stream_;
      OVar50.enum_ = GlobalGet;
      goto LAB_0013aaaa;
    case GlobalSet:
      pMVar3 = this->module_;
      pVVar37 = cast<wabt::VarExpr<(wabt::ExprType)19>,wabt::Expr>(base);
      IVar6 = Module::GetGlobalIndex(pMVar3,&pVVar37->var);
      pSVar49 = this->stream_;
      OVar50.enum_ = GlobalSet;
LAB_0013aaaa:
      WriteOpcode(pSVar49,OVar50);
      pcVar42 = "global.get global index";
      reloc_type = GlobalIndexLEB;
      goto LAB_0013abab;
    case If:
      pIVar43 = cast<wabt::IfExpr,wabt::Expr>(base);
      WriteOpcode(this->stream_,(Opcode)0x4);
      WriteBlockDecl(this,&(pIVar43->true_).decl);
      WriteExprList(this,func,&(pIVar43->true_).exprs);
      if ((pIVar43->false_).size_ != 0) {
        WriteOpcode(this->stream_,(Opcode)0x5);
        goto LAB_0013ac59;
      }
      goto LAB_0013ac67;
    case Load:
      pLVar9 = (LoadStoreExpr<(wabt::ExprType)43> *)
               cast<wabt::LoadStoreExpr<(wabt::ExprType)21>,wabt::Expr>(base);
      goto LAB_0013a7e6;
    case LocalGet:
      pVVar35 = cast<wabt::VarExpr<(wabt::ExprType)22>,wabt::Expr>(base);
      value = GetLocalIndex((BinaryWriter *)func,(Func *)&pVVar35->var,var_01);
      pSVar49 = this->stream_;
      OVar50.enum_ = LocalGet;
      goto LAB_0013ab2a;
    case LocalSet:
      pVVar39 = cast<wabt::VarExpr<(wabt::ExprType)23>,wabt::Expr>(base);
      value = GetLocalIndex((BinaryWriter *)func,(Func *)&pVVar39->var,var_02);
      pSVar49 = this->stream_;
      OVar50.enum_ = LocalSet;
      goto LAB_0013ab2a;
    case LocalTee:
      pVVar24 = cast<wabt::VarExpr<(wabt::ExprType)24>,wabt::Expr>(base);
      value = GetLocalIndex((BinaryWriter *)func,(Func *)&pVVar24->var,var_00);
      pSVar49 = this->stream_;
      OVar50.enum_ = LocalTee;
LAB_0013ab2a:
      WriteOpcode(pSVar49,OVar50);
      pSVar49 = this->stream_;
      pcVar42 = "local index";
      break;
    case Loop:
      WriteOpcode(this->stream_,(Opcode)0x3);
      pBVar23 = cast<wabt::BlockExprBase<(wabt::ExprType)25>,wabt::Expr>(base);
      WriteBlockDecl(this,&(pBVar23->block).decl);
      pBVar23 = cast<wabt::BlockExprBase<(wabt::ExprType)25>,wabt::Expr>(base);
LAB_0013a6af:
      exprs_00 = &(pBVar23->block).exprs;
LAB_0013ac62:
      WriteExprList(this,func,exprs_00);
LAB_0013ac67:
      pSVar49 = this->stream_;
      OVar50.enum_ = End;
      goto LAB_0013ac6d;
    case MemoryCopy:
      WriteOpcode(this->stream_,(Opcode)0xc8);
      WriteU32Leb128(this->stream_,0,"memory.copy reserved");
      pSVar49 = this->stream_;
      value = 0;
      pcVar42 = "memory.copy reserved";
      break;
    case DataDrop:
      pMVar3 = this->module_;
      pVVar12 = cast<wabt::VarExpr<(wabt::ExprType)27>,wabt::Expr>(base);
      IVar6 = Module::GetDataSegmentIndex(pMVar3,&pVVar12->var);
      WriteOpcode(this->stream_,(Opcode)0xc7);
      pSVar49 = this->stream_;
      pcVar42 = "data.drop segment";
      goto LAB_0013a981;
    case MemoryFill:
      WriteOpcode(this->stream_,(Opcode)0xc9);
      pSVar49 = this->stream_;
      pcVar42 = "memory.fill reserved";
      goto LAB_0013ab6d;
    case MemoryGrow:
      WriteOpcode(this->stream_,(Opcode)0x34);
      pSVar49 = this->stream_;
      pcVar42 = "memory.grow reserved";
      goto LAB_0013ab6d;
    case MemoryInit:
      pMVar3 = this->module_;
      pVVar33 = cast<wabt::VarExpr<(wabt::ExprType)30>,wabt::Expr>(base);
      IVar6 = Module::GetDataSegmentIndex(pMVar3,&pVVar33->var);
      WriteOpcode(this->stream_,(Opcode)0xc6);
      WriteU32Leb128(this->stream_,IVar6,"memory.init segment");
      pSVar49 = this->stream_;
      pcVar42 = "memory.init reserved";
      IVar6 = 0;
LAB_0013a981:
      WriteU32Leb128(pSVar49,IVar6,pcVar42);
      this->has_data_segment_instruction_ = true;
      goto switchD_0013a235_default;
    case MemorySize:
      WriteOpcode(this->stream_,(Opcode)0x33);
      pSVar49 = this->stream_;
      pcVar42 = "memory.size reserved";
LAB_0013ab6d:
      value = 0;
      break;
    case Nop:
      pSVar49 = this->stream_;
      OVar50.enum_ = Nop;
      goto LAB_0013ac6d;
    case RefIsNull:
      pSVar49 = this->stream_;
      OVar50.enum_ = RefIsNull;
      goto LAB_0013ac6d;
    case RefFunc:
      WriteOpcode(this->stream_,(Opcode)0xd4);
      pMVar3 = this->module_;
      pVVar13 = cast<wabt::VarExpr<(wabt::ExprType)34>,wabt::Expr>(base);
      IVar6 = Module::GetFuncIndex(pMVar3,&pVVar13->var);
      goto LAB_0013aba9;
    case RefNull:
      pSVar49 = this->stream_;
      OVar50.enum_ = RefNull;
      goto LAB_0013ac6d;
    case Rethrow:
      pSVar49 = this->stream_;
      OVar50.enum_ = Rethrow;
      goto LAB_0013ac6d;
    case Return:
      pSVar49 = this->stream_;
      OVar50.enum_ = Return;
      goto LAB_0013ac6d;
    case ReturnCall:
      pMVar3 = this->module_;
      pVVar40 = cast<wabt::VarExpr<(wabt::ExprType)38>,wabt::Expr>(base);
      IVar6 = Module::GetFuncIndex(pMVar3,&pVVar40->var);
      pSVar49 = this->stream_;
      OVar50.enum_ = ReturnCall;
LAB_0013ab93:
      WriteOpcode(pSVar49,OVar50);
LAB_0013aba9:
      pcVar42 = "block type function index";
      reloc_type = First;
LAB_0013abab:
      WriteU32Leb128WithReloc(this,IVar6,pcVar42 + 0xb,reloc_type);
      goto switchD_0013a235_default;
    case ReturnCallIndirect:
      pMVar3 = this->module_;
      pRVar36 = cast<wabt::ReturnCallIndirectExpr,wabt::Expr>(base);
      IVar6 = Module::GetFuncTypeIndex(pMVar3,&pRVar36->decl);
      pMVar3 = this->module_;
      pRVar36 = cast<wabt::ReturnCallIndirectExpr,wabt::Expr>(base);
      value = Module::GetTableIndex(pMVar3,&pRVar36->table);
      pSVar49 = this->stream_;
      OVar50.enum_ = ReturnCallIndirect;
LAB_0013aa5b:
      WriteOpcode(pSVar49,OVar50);
      WriteU32Leb128WithReloc(this,IVar6,"signature index",TypeIndexLEB);
      pSVar49 = this->stream_;
      pcVar42 = "table index";
      break;
    case Select:
      pSVar20 = cast<wabt::SelectExpr,wabt::Expr>(base);
      pTVar51 = (pSVar20->result_type).super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>.
                _M_impl.super__Vector_impl_data._M_start;
      if (((long)(pSVar20->result_type).super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>.
                 _M_impl.super__Vector_impl_data._M_finish - (long)pTVar51 == 4) &&
         (pTVar51->enum_ == Any)) {
        pSVar49 = this->stream_;
        OVar50.enum_ = Select;
        goto LAB_0013ac6d;
      }
      WriteOpcode(this->stream_,(Opcode)0x16);
      WriteU32Leb128(this->stream_,
                     (uint32_t)
                     ((ulong)((long)(pSVar20->result_type).
                                    super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>.
                                    _M_impl.super__Vector_impl_data._M_finish -
                             (long)(pSVar20->result_type).
                                   super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>.
                                   _M_impl.super__Vector_impl_data._M_start) >> 2),
                     "num result types");
      pTVar2 = (pSVar20->result_type).super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>.
               _M_impl.super__Vector_impl_data._M_finish;
      for (pTVar51 = (pSVar20->result_type).
                     super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
                     super__Vector_impl_data._M_start; pTVar51 != pTVar2; pTVar51 = pTVar51 + 1) {
        WriteType(this->stream_,(Type)pTVar51->enum_,"result type");
      }
      goto switchD_0013a235_default;
    case SimdLaneOp:
      pSVar27 = cast<wabt::SimdLaneOpExpr,wabt::Expr>(base);
      WriteOpcode(this->stream_,(Opcode)(pSVar27->opcode).enum_);
      pSVar49 = this->stream_;
      pSVar27 = cast<wabt::SimdLaneOpExpr,wabt::Expr>(base);
      Stream::WriteU8(pSVar49,(uint)(byte)pSVar27->val,"Simd Lane literal",No);
      goto switchD_0013a235_default;
    case SimdShuffleOp:
      pSVar38 = cast<wabt::SimdShuffleOpExpr,wabt::Expr>(base);
      WriteOpcode(this->stream_,(Opcode)(pSVar38->opcode).enum_);
      pSVar49 = this->stream_;
      pSVar38 = cast<wabt::SimdShuffleOpExpr,wabt::Expr>(base);
      uVar47 = *(undefined8 *)(pSVar38->val).v;
      uVar48 = *(undefined8 *)((pSVar38->val).v + 8);
      pcVar42 = "Simd Lane[16] literal";
LAB_0013ab02:
      value_00.v[8] = (char)uVar48;
      value_00.v[9] = (char)((ulong)uVar48 >> 8);
      value_00.v[10] = (char)((ulong)uVar48 >> 0x10);
      value_00.v[0xb] = (char)((ulong)uVar48 >> 0x18);
      value_00.v[0xc] = (char)((ulong)uVar48 >> 0x20);
      value_00.v[0xd] = (char)((ulong)uVar48 >> 0x28);
      value_00.v[0xe] = (char)((ulong)uVar48 >> 0x30);
      value_00.v[0xf] = (char)((ulong)uVar48 >> 0x38);
      value_00.v[0] = (char)uVar47;
      value_00.v[1] = (char)((ulong)uVar47 >> 8);
      value_00.v[2] = (char)((ulong)uVar47 >> 0x10);
      value_00.v[3] = (char)((ulong)uVar47 >> 0x18);
      value_00.v[4] = (char)((ulong)uVar47 >> 0x20);
      value_00.v[5] = (char)((ulong)uVar47 >> 0x28);
      value_00.v[6] = (char)((ulong)uVar47 >> 0x30);
      value_00.v[7] = (char)((ulong)uVar47 >> 0x38);
      Stream::WriteU128(pSVar49,value_00,pcVar42,No);
      goto switchD_0013a235_default;
    case LoadSplat:
      pLVar9 = cast<wabt::LoadStoreExpr<(wabt::ExprType)43>,wabt::Expr>(base);
LAB_0013a7e6:
      WriteOpcode(this->stream_,(Opcode)(pLVar9->opcode).enum_);
      AVar7 = Opcode::GetAlignment(&pLVar9->opcode,pLVar9->align);
      pSVar49 = this->stream_;
      bVar5 = log2_u32(AVar7);
      Stream::WriteU8(pSVar49,(uint)bVar5,"alignment",No);
      pSVar49 = this->stream_;
      value = pLVar9->offset;
      pcVar42 = "load offset";
      break;
    case Store:
      pLVar14 = cast<wabt::LoadStoreExpr<(wabt::ExprType)44>,wabt::Expr>(base);
      WriteOpcode(this->stream_,(Opcode)(pLVar14->opcode).enum_);
      AVar7 = Opcode::GetAlignment(&pLVar14->opcode,pLVar14->align);
      pSVar49 = this->stream_;
      bVar5 = log2_u32(AVar7);
      Stream::WriteU8(pSVar49,(uint)bVar5,"alignment",No);
      pSVar49 = this->stream_;
      value = pLVar14->offset;
      pcVar42 = "store offset";
      break;
    case TableCopy:
      pTVar34 = cast<wabt::TableCopyExpr,wabt::Expr>(base);
      IVar6 = Module::GetTableIndex(this->module_,&pTVar34->dst_table);
      value = Module::GetTableIndex(this->module_,&pTVar34->src_table);
      WriteOpcode(this->stream_,(Opcode)0xcc);
      WriteU32Leb128(this->stream_,IVar6,"table.copy dst_table");
      pSVar49 = this->stream_;
      pcVar42 = "table.copy src_table";
      break;
    case ElemDrop:
      pMVar3 = this->module_;
      pVVar45 = cast<wabt::VarExpr<(wabt::ExprType)46>,wabt::Expr>(base);
      value = Module::GetElemSegmentIndex(pMVar3,&pVVar45->var);
      WriteOpcode(this->stream_,(Opcode)0xcb);
      pSVar49 = this->stream_;
      pcVar42 = "elem.drop segment";
      break;
    case TableInit:
      pTVar10 = cast<wabt::TableInitExpr,wabt::Expr>(base);
      value = Module::GetTableIndex(this->module_,&pTVar10->table_index);
      IVar6 = Module::GetElemSegmentIndex(this->module_,&pTVar10->segment_index);
      WriteOpcode(this->stream_,(Opcode)0xca);
      WriteU32Leb128(this->stream_,IVar6,"table.init segment");
      pSVar49 = this->stream_;
      pcVar42 = "table.init table";
      break;
    case TableGet:
      pMVar3 = this->module_;
      pVVar15 = cast<wabt::VarExpr<(wabt::ExprType)48>,wabt::Expr>(base);
      value = Module::GetTableIndex(pMVar3,&pVVar15->var);
      WriteOpcode(this->stream_,(Opcode)0xcd);
      pSVar49 = this->stream_;
      pcVar42 = "table.get table index";
      break;
    case TableGrow:
      pMVar3 = this->module_;
      pVVar19 = cast<wabt::VarExpr<(wabt::ExprType)49>,wabt::Expr>(base);
      value = Module::GetTableIndex(pMVar3,&pVVar19->var);
      WriteOpcode(this->stream_,(Opcode)0xcf);
      pSVar49 = this->stream_;
      pcVar42 = "table.grow table index";
      break;
    case TableSize:
      pMVar3 = this->module_;
      pVVar8 = cast<wabt::VarExpr<(wabt::ExprType)50>,wabt::Expr>(base);
      value = Module::GetTableIndex(pMVar3,&pVVar8->var);
      WriteOpcode(this->stream_,(Opcode)0xd0);
      pSVar49 = this->stream_;
      pcVar42 = "table.size table index";
      break;
    case TableSet:
      pMVar3 = this->module_;
      pVVar46 = cast<wabt::VarExpr<(wabt::ExprType)51>,wabt::Expr>(base);
      value = Module::GetTableIndex(pMVar3,&pVVar46->var);
      WriteOpcode(this->stream_,(Opcode)0xce);
      pSVar49 = this->stream_;
      pcVar42 = "table.set table index";
      break;
    case TableFill:
      pMVar3 = this->module_;
      pVVar44 = cast<wabt::VarExpr<(wabt::ExprType)52>,wabt::Expr>(base);
      value = Module::GetTableIndex(pMVar3,&pVVar44->var);
      WriteOpcode(this->stream_,(Opcode)0xd1);
      pSVar49 = this->stream_;
      pcVar42 = "table.fill table index";
      break;
    case Ternary:
      pSVar49 = this->stream_;
      pOVar11 = cast<wabt::OpcodeExpr<(wabt::ExprType)53>,wabt::Expr>(base);
      goto LAB_0013a407;
    case Throw:
      pcVar42 = (char *)0x8;
      WriteOpcode(this->stream_,(Opcode)0x8);
      pSVar49 = this->stream_;
      pVVar41 = cast<wabt::VarExpr<(wabt::ExprType)54>,wabt::Expr>(base);
      pcVar42 = Var::index(&pVVar41->var,pcVar42,__c_01);
      value = (uint32_t)pcVar42;
      pcVar42 = "throw event";
      break;
    case Try:
      pIVar43 = (IfExpr *)cast<wabt::TryExpr,wabt::Expr>(base);
      WriteOpcode(this->stream_,(Opcode)0x6);
      WriteBlockDecl(this,&(pIVar43->true_).decl);
      WriteExprList(this,func,&(pIVar43->true_).exprs);
      WriteOpcode(this->stream_,(Opcode)0x7);
LAB_0013ac59:
      exprs_00 = &pIVar43->false_;
      goto LAB_0013ac62;
    case Unary:
      pSVar49 = this->stream_;
      pOVar11 = (OpcodeExpr<(wabt::ExprType)53> *)
                cast<wabt::OpcodeExpr<(wabt::ExprType)56>,wabt::Expr>(base);
LAB_0013a407:
      OVar50.enum_ = (pOVar11->opcode).enum_;
      goto LAB_0013ac6d;
    case Last:
      pSVar49 = this->stream_;
      OVar50.enum_ = Unreachable;
LAB_0013ac6d:
      WriteOpcode(pSVar49,OVar50);
    default:
      goto switchD_0013a235_default;
    }
    WriteU32Leb128(pSVar49,value,pcVar42);
switchD_0013a235_default:
    intrusive_list<wabt::Expr>::const_iterator::operator++(&__begin2);
  } while( true );
}

Assistant:

void BinaryWriter::WriteExprList(const Func* func, const ExprList& exprs) {
  for (const Expr& expr : exprs) {
    WriteExpr(func, &expr);
  }
}